

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  byte bVar1;
  ushort uVar2;
  ushort *puVar3;
  ulong uVar4;
  char *pcVar5;
  byte *__src;
  ushort *puVar6;
  uint uVar7;
  size_t l;
  long lVar8;
  ulong uVar9;
  size_t l_1;
  char *pcVar10;
  int local_40;
  
  pcVar5 = dest + originalSize;
  local_40 = -1;
  puVar3 = (ushort *)source;
  pcVar10 = dest;
  while( true ) {
    uVar2 = *puVar3;
    __src = (byte *)((long)puVar3 + 1);
    uVar7 = (uint)(byte)((byte)uVar2 >> 4);
    uVar9 = (ulong)uVar7;
    if (uVar7 == 0xf) {
      lVar8 = 0;
      do {
        bVar1 = *__src;
        __src = __src + 1;
        lVar8 = lVar8 + (ulong)bVar1;
      } while ((ulong)bVar1 == 0xff);
      uVar9 = lVar8 + 0xf;
    }
    if ((ulong)((long)pcVar5 - (long)pcVar10) < uVar9) {
      return -1;
    }
    memmove(pcVar10,__src,uVar9);
    pcVar10 = pcVar10 + uVar9;
    puVar6 = (ushort *)(__src + uVar9);
    if ((ulong)((long)pcVar5 - (long)pcVar10) < 0xc) {
      if (pcVar10 == pcVar5) {
        local_40 = (int)source;
        local_40 = (int)puVar6 - local_40;
      }
      return local_40;
    }
    uVar9 = (ulong)((byte)uVar2 & 0xf);
    puVar3 = puVar6 + 1;
    if (uVar9 == 0xf) {
      lVar8 = 0;
      do {
        uVar2 = *puVar3;
        puVar3 = (ushort *)((long)puVar3 + 1);
        lVar8 = lVar8 + (ulong)(byte)uVar2;
      } while ((ulong)(byte)uVar2 == 0xff);
      uVar9 = lVar8 + 0xf;
    }
    uVar9 = uVar9 + 4;
    if ((ulong)((long)pcVar5 - (long)pcVar10) < uVar9) break;
    uVar2 = *puVar6;
    if ((ulong)((long)pcVar10 - (long)dest) < (ulong)uVar2) {
      return -1;
    }
    if (uVar9 != 0) {
      uVar4 = 0;
      do {
        pcVar10[uVar4] = pcVar10[uVar4 - uVar2];
        uVar4 = uVar4 + 1;
      } while (uVar9 != uVar4);
    }
    pcVar10 = pcVar10 + uVar9;
    if ((ulong)((long)pcVar5 - (long)pcVar10) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    DEBUGLOG(5, "LZ4_decompress_fast");
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, NULL, 0);
}